

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O0

void __thiscall Snes_Spc::dsp_write(Snes_Spc *this,int data,rel_time_t time)

{
  char cVar1;
  uint uVar2;
  ssize_t sVar3;
  Spc_Dsp *pSVar4;
  int in_EDX;
  uint uVar5;
  uint in_ESI;
  Spc_Dsp *in_RDI;
  int r;
  int clock_count;
  int count;
  int in_stack_000000ec;
  Spc_Dsp *in_stack_000000f0;
  
  uVar5 = (uint)(char)in_RDI[1].m.regs[*(byte *)((long)in_RDI[1].m.voices[0].buf + 0x12)];
  uVar2 = (in_EDX - uVar5) - in_RDI[1].m.voices[0].buf[0x12];
  pSVar4 = in_RDI;
  if ((int)uVar2 < 0) {
    if (in_RDI[1].m.voices[0].buf[0x12] == 0x7f) {
      cVar1 = *(char *)((long)in_RDI[1].m.voices[0].buf + 0x12);
      if (cVar1 == 'L') {
        sVar3 = Spc_Dsp::read(in_RDI,0x5c,(void *)(ulong)uVar5,(size_t)in_RDI);
        uVar2 = in_ESI & ((uint)sVar3 ^ 0xffffffff) | in_RDI[1].m.voices[0].buf[0x16];
        pSVar4 = (Spc_Dsp *)(ulong)uVar2;
        in_RDI[1].m.voices[0].buf[0x16] = uVar2;
      }
      if (cVar1 == '\\') {
        in_RDI[1].m.voices[0].buf[0x17] = in_ESI | in_RDI[1].m.voices[0].buf[0x17];
        uVar2 = (in_ESI ^ 0xffffffff) & in_RDI[1].m.voices[0].buf[0x16];
        pSVar4 = (Spc_Dsp *)(ulong)uVar2;
        in_RDI[1].m.voices[0].buf[0x16] = uVar2;
      }
    }
  }
  else {
    in_RDI[1].m.voices[0].buf[0x12] = (uVar2 & 0xffffffe0) + 0x20 + in_RDI[1].m.voices[0].buf[0x12];
    Spc_Dsp::run(in_stack_000000f0,in_stack_000000ec);
  }
  if (*(byte *)((long)in_RDI[1].m.voices[0].buf + 0x12) < 0x80) {
    Spc_Dsp::write(in_RDI,(uint)*(byte *)((long)in_RDI[1].m.voices[0].buf + 0x12),
                   (void *)(ulong)in_ESI,(size_t)pSVar4);
  }
  return;
}

Assistant:

inline void Snes_Spc::dsp_write( int data, rel_time_t time )
{
	RUN_DSP( time, reg_times [REGS [r_dspaddr]] )
	#if SPC_LESS_ACCURATE
		else if ( m.dsp_time == skipping_time )
		{
			int r = REGS [r_dspaddr];
			if ( r == Spc_Dsp::r_kon )
				m.skipped_kon |= data & ~dsp.read( Spc_Dsp::r_koff );
			
			if ( r == Spc_Dsp::r_koff )
			{
				m.skipped_koff |= data;
				m.skipped_kon &= ~data;
			}
		}
	#endif
	
	#ifdef SPC_DSP_WRITE_HOOK
		SPC_DSP_WRITE_HOOK( m.spc_time + time, REGS [r_dspaddr], (uint8_t) data );
	#endif
	
	if ( REGS [r_dspaddr] <= 0x7F )
		dsp.write( REGS [r_dspaddr], data );
	else if ( !SPC_MORE_ACCURACY )
		debug_printf( "SPC wrote to DSP register > $7F\n" );
}